

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void D_PageDrawer(void)

{
  if (Page == (FTexture *)0x0) {
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,0,0,(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
               (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height,0,0);
    if (PageBlank == false) {
      DCanvas::DrawText((DCanvas *)screen,SmallFont,9,0,0,"Page graphic goes here",0);
    }
  }
  else {
    DCanvas::DrawTexture((DCanvas *)screen,Page,0.0,0.0,0x400013ae,1,0x400013a5,0,0x400013ab,1,0);
    DCanvas::FillBorder((DCanvas *)screen,(FTexture *)0x0);
  }
  if (Advisory != (FTexture *)0x0) {
    DCanvas::DrawTexture((DCanvas *)screen,Advisory,4.0,160.0,0x40001391,1,0);
    return;
  }
  return;
}

Assistant:

void D_PageDrawer (void)
{
	if (Page != NULL)
	{
		screen->DrawTexture (Page, 0, 0,
			DTA_Fullscreen, true,
			DTA_Masked, false,
			DTA_BilinearFilter, true,
			TAG_DONE);
		screen->FillBorder (NULL);
	}
	else
	{
		screen->Clear (0, 0, SCREENWIDTH, SCREENHEIGHT, 0, 0);
		if (!PageBlank)
		{
			screen->DrawText (SmallFont, CR_WHITE, 0, 0, "Page graphic goes here", TAG_DONE);
		}
	}
	if (Advisory != NULL)
	{
		screen->DrawTexture (Advisory, 4, 160, DTA_320x200, true, TAG_DONE);
	}
}